

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBarLayout::setAlignment(ToolBarLayout *this,Alignment a)

{
  if (((a.i & 0xe7) != 0) && ((this->align).i != a.i)) {
    (this->align).i = a.i & 0xe7;
    QLayout::update();
    return;
  }
  return;
}

Assistant:

void
ToolBarLayout::setAlignment( Qt::Alignment a )
{
	if( a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom ) )
	{
		if( align != a )
		{
			align = a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom );

			update();
		}
	}
}